

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void DFS(bb_t_conflict bb,size_t *pre,size_t *rpost)

{
  size_t sVar1;
  out_edge_t peVar2;
  bb_t_conflict bb_00;
  
  sVar1 = *pre;
  *pre = sVar1 + 1;
  bb->pre = sVar1;
  for (peVar2 = (bb->out_edges).head; peVar2 != (out_edge_t)0x0; peVar2 = (peVar2->out_link).next) {
    bb_00 = peVar2->dst;
    if (bb_00->pre == 0) {
      DFS(bb_00,pre,rpost);
    }
    else if (bb_00->rpost == 0) {
      peVar2->back_edge_p = '\x01';
    }
  }
  sVar1 = *rpost;
  *rpost = sVar1 - 1;
  bb->rpost = sVar1;
  return;
}

Assistant:

static void DFS (bb_t bb, size_t *pre, size_t *rpost) {
  edge_t e;

  bb->pre = (*pre)++;
  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e))
    if (e->dst->pre == 0)
      DFS (e->dst, pre, rpost);
    else if (e->dst->rpost == 0)
      e->back_edge_p = TRUE;
  bb->rpost = (*rpost)--;
}